

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void __thiscall cereal::JSONInputArchive::startNode(JSONInputArchive *this)

{
  char *__s1;
  pointer pIVar1;
  int iVar2;
  Ch *__s2;
  GenericValue *pGVar3;
  Pointer this_00;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_28;
  GenericMemberIterator<true,_rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_20;
  
  __s1 = this->itsNextName;
  this->itsNextName = (char *)0x0;
  if (__s1 != (char *)0x0) {
    pIVar1 = (this->itsIteratorStack).
             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pIVar1[-1].itsType == Member) &&
       (this_00 = pIVar1[-1].itsMemberItBegin.ptr_ + pIVar1[-1].itsIndex,
       this_00 != pIVar1[-1].itsMemberItEnd.ptr_)) {
      __s2 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(&this_00->name);
    }
    else {
      __s2 = (char *)0x0;
    }
    if (__s2 != (char *)0x0) {
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) goto LAB_0015772a;
    }
    Iterator::search((this->itsIteratorStack).
                     super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1,__s1);
  }
LAB_0015772a:
  pGVar3 = Iterator::value((this->itsIteratorStack).
                           super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1);
  if ((pGVar3->data_).f.flags == 4) {
    pGVar3 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_20.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::Begin(pGVar3);
    pGVar3 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::End(pGVar3);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*,rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>const*>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)&local_20,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                **)&local_28);
  }
  else {
    pGVar3 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_20.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberBegin(pGVar3);
    pGVar3 = Iterator::value((this->itsIteratorStack).
                             super__Vector_base<cereal::JSONInputArchive::Iterator,_std::allocator<cereal::JSONInputArchive::Iterator>_>
                             ._M_impl.super__Vector_impl_data._M_finish + -1);
    local_28.ptr_ =
         (Pointer)rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::MemberEnd(pGVar3);
    std::
    vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>::
    emplace_back<rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::GenericMemberIterator<true,rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((vector<cereal::JSONInputArchive::Iterator,std::allocator<cereal::JSONInputArchive::Iterator>>
                *)&this->itsIteratorStack,&local_20,&local_28);
  }
  return;
}

Assistant:

void startNode()
      {
        search();

        if(itsIteratorStack.back().value().IsArray())
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().Begin(), itsIteratorStack.back().value().End());
        else
          itsIteratorStack.emplace_back(itsIteratorStack.back().value().MemberBegin(), itsIteratorStack.back().value().MemberEnd());
      }